

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O0

vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_> *
__thiscall
wavingz::encoder<signed_char>::operator()
          (vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
           *__return_storage_ptr__,encoder<signed_char> *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_begin,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          payload_end,double silence)

{
  size_t sVar1;
  bool bVar2;
  reference puVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  pair<signed_char,_signed_char> local_7a;
  ulong local_78;
  size_t ii_2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> ch
  ;
  size_t ii_1;
  size_t sample;
  pair<signed_char,_signed_char> local_42;
  ulong local_40;
  size_t ii;
  uint8_t SOF;
  double dStack_30;
  uint8_t PREAMBLE;
  double silence_local;
  encoder<signed_char> *this_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  payload_end_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  payload_begin_local;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  *iq;
  
  ii._7_1_ = 0x55;
  ii._6_1_ = 0xf0;
  ii._5_1_ = 0;
  dStack_30 = silence;
  silence_local = (double)this;
  this_local = (encoder<signed_char> *)payload_end._M_current;
  payload_end_local = payload_begin;
  std::
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  ::vector(__return_storage_ptr__);
  for (local_40 = 0; local_40 != this->sample_rate / 1000; local_40 = local_40 + 1) {
    dVar5 = iir_filter<6>::operator()(&this->lp1,0.0);
    dVar6 = iir_filter<6>::operator()(&this->lp2,0.0);
    local_42 = complex8_convert<signed_char>::operator()(&this->convert_iq,dVar5,dVar6);
    std::
    vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>::
    emplace_back<std::pair<signed_char,signed_char>>
              ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                *)__return_storage_ptr__,&local_42);
  }
  ii_1 = 0;
  for (ch._M_current = (uchar *)0x0; ch._M_current != (uchar *)0x14;
      ch._M_current = ch._M_current + 1) {
    emplace_byte(this,'U',&ii_1,__return_storage_ptr__);
  }
  emplace_byte(this,-0x10,&ii_1,__return_storage_ptr__);
  ii_2 = (size_t)payload_end_local._M_current;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&ii_2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      *)&this_local), bVar2) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&ii_2);
    emplace_byte(this,*puVar3,&ii_1,__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&ii_2);
  }
  for (local_78 = 0; sVar1 = this->sample_rate, auVar7._8_4_ = (int)(sVar1 >> 0x20),
      auVar7._0_8_ = sVar1, auVar7._12_4_ = 0x45300000,
      dVar5 = dStack_30 *
              ((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)), uVar4 = (ulong)dVar5,
      local_78 != (uVar4 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f);
      local_78 = local_78 + 1) {
    dVar5 = iir_filter<6>::operator()(&this->lp1,0.0);
    dVar6 = iir_filter<6>::operator()(&this->lp2,0.0);
    local_7a = complex8_convert<signed_char>::operator()(&this->convert_iq,dVar5,dVar6);
    std::
    vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>::
    emplace_back<std::pair<signed_char,signed_char>>
              ((vector<std::pair<signed_char,signed_char>,std::allocator<std::pair<signed_char,signed_char>>>
                *)__return_storage_ptr__,&local_7a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Byte, Byte>>
    operator()(It payload_begin, It payload_end, double silence = 1.0)
    {
        constexpr uint8_t PREAMBLE = 0x55; // 10101010...10101010 frame preamble
        constexpr uint8_t SOF = 0xF0;      // Start of frame mark

        std::vector<std::pair<Byte, Byte>> iq;

        // .001" silence
        for (size_t ii(0); ii != sample_rate / 1000; ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }

        size_t sample = 0;

        // preamble
        for (size_t ii(0); ii != 20; ++ii) {
            emplace_byte(PREAMBLE, sample, iq);
        }

        // SOF
        emplace_byte(SOF, sample, iq);

        // payload
        for (It ch = payload_begin; ch != payload_end; ++ch) {
            emplace_byte(*ch, sample, iq);
        }

        // silence at the end (it seems that more or less 1" is needed by the HackRF
        // One to complete transmission?)
        for (size_t ii(0); ii != size_t(silence*sample_rate); ++ii) {
            iq.emplace_back(convert_iq(lp1(0.0), lp2(0.0)));
        }
        return iq;
    }